

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exception.c++
# Opt level: O0

void __thiscall kj::Exception::extendTrace(Exception *this,uint ignoreCount,uint limit)

{
  uint uVar1;
  WiderType<Decay<unsigned_long>,_Decay<unsigned_int_&>_> WVar2;
  size_t sVar3;
  WiderType<Decay<unsigned_long>,_Decay<unsigned_long>_> count;
  void **__src;
  size_t size;
  ArrayPtr<void_*> space;
  ArrayPtr<void_*> AVar4;
  ArrayPtr<void_*const> AVar5;
  ArrayPtr<const_unsigned_char> local_208;
  size_t local_1f8;
  unsigned_long local_1f0;
  ArrayPtr<void_*const> local_1e8;
  kj *local_1d8;
  void **ppvStack_1d0;
  undefined1 auStack_1c8 [8];
  ArrayPtr<void_*const> newTrace;
  kj *pkStack_1a0;
  ArrayPtr<void_*> newTraceSpace;
  Array<void_*> newTraceSpace_heap;
  void *newTraceSpace_stack [40];
  size_t sStack_28;
  bool newTraceSpace_isOnStack;
  kj *local_20;
  size_t newTraceSpace_size;
  uint limit_local;
  uint ignoreCount_local;
  Exception *this_local;
  
  if ((this->isFullTrace & 1U) == 0) {
    newTraceSpace_size._0_4_ = limit;
    newTraceSpace_size._4_4_ = ignoreCount;
    _limit_local = this;
    sStack_28 = size<void*,32ul>(&this->trace);
    WVar2 = min<unsigned_long,unsigned_int&>(&stack0xffffffffffffffd8,(uint *)&newTraceSpace_size);
    local_20 = (kj *)(WVar2 + newTraceSpace_size._4_4_ + 1);
    if (local_20 < (kj *)0x29) {
      Array<void_*>::Array((Array<void_*> *)&newTraceSpace.size_,(void *)0x0);
      AVar4 = arrayPtr<void*>(&newTraceSpace_heap.disposer,(size_t)local_20);
      pkStack_1a0 = (kj *)AVar4.ptr;
    }
    else {
      heapArray<void*>((Array<void_*> *)&newTraceSpace.size_,local_20,size);
      AVar4 = kj::Array::operator_cast_to_ArrayPtr((Array *)&newTraceSpace.size_);
      pkStack_1a0 = (kj *)AVar4.ptr;
    }
    newTraceSpace.ptr = (void **)AVar4.size_;
    local_1d8 = pkStack_1a0;
    ppvStack_1d0 = newTraceSpace.ptr;
    space.size_._0_4_ = newTraceSpace_size._4_4_ + 1;
    space.ptr = newTraceSpace.ptr;
    space.size_._4_4_ = 0;
    AVar5 = kj::getStackTrace(pkStack_1a0,space,(uint)AVar4.ptr);
    newTrace.ptr = (void **)AVar5.size_;
    auStack_1c8 = (undefined1  [8])AVar5.ptr;
    sVar3 = ArrayPtr<void_*const>::size((ArrayPtr<void_*const> *)auStack_1c8);
    if (newTraceSpace_size._4_4_ + 2 < sVar3) {
      sVar3 = size<void*,32ul>(&this->trace);
      local_1f0 = sVar3 - this->traceCount;
      local_1f8 = ArrayPtr<void_*const>::size((ArrayPtr<void_*const> *)auStack_1c8);
      count = min<unsigned_long,unsigned_long>(&local_1f0,&local_1f8);
      local_1e8 = ArrayPtr<void_*const>::first((ArrayPtr<void_*const> *)auStack_1c8,count);
      newTrace.ptr = (void **)local_1e8.size_;
      auStack_1c8 = (undefined1  [8])local_1e8.ptr;
      uVar1 = this->traceCount;
      __src = ArrayPtr<void_*const>::begin((ArrayPtr<void_*const> *)auStack_1c8);
      local_208 = ArrayPtr<void_*const>::asBytes((ArrayPtr<void_*const> *)auStack_1c8);
      sVar3 = ArrayPtr<const_unsigned_char>::size(&local_208);
      memcpy(this->trace + uVar1,__src,sVar3);
      sVar3 = ArrayPtr<void_*const>::size((ArrayPtr<void_*const> *)auStack_1c8);
      this->traceCount = this->traceCount + (int)sVar3;
      this->isFullTrace = true;
    }
    Array<void_*>::~Array((Array<void_*> *)&newTraceSpace.size_);
  }
  return;
}

Assistant:

void Exception::extendTrace(uint ignoreCount, uint limit) {
  if (isFullTrace) {
    // Awkward: extendTrace() was called twice without truncating in between. This should probably
    // be an error, but historically we didn't check for this so I'm hesitant to make it an error
    // now. We shouldn't actually extend the trace, though, as our current trace is presumably
    // rooted in main() and it'd be weird to append frames "above" that.
    // TODO(cleanup): Abort here and see what breaks?
    return;
  }

  KJ_STACK_ARRAY(void*, newTraceSpace, kj::min(kj::size(trace), limit) + ignoreCount + 1,
      sizeof(trace)/sizeof(trace[0]) + 8, 128);

  auto newTrace = kj::getStackTrace(newTraceSpace, ignoreCount + 1);
  if (newTrace.size() > ignoreCount + 2) {
    // Remove suffix that won't fit into our static-sized trace.
    newTrace = newTrace.first(kj::min(kj::size(trace) - traceCount, newTrace.size()));

    // Copy the rest into our trace.
    memcpy(trace + traceCount, newTrace.begin(), newTrace.asBytes().size());
    traceCount += newTrace.size();
    isFullTrace = true;
  }
}